

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

uint __thiscall Js::FunctionBody::GetNumberOfRecursiveCallSites(FunctionBody *this)

{
  DynamicProfileInfo *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  pDVar1 = (this->dynamicProfileInfo).ptr;
  uVar3 = 0;
  uVar4 = 0;
  if (pDVar1 != (DynamicProfileInfo *)0x0) {
    uVar4 = pDVar1->m_recursiveInlineInfo;
  }
  if (uVar4 != 0) {
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    do {
      uVar3 = uVar3 + (uVar4 & 1);
      uVar5 = uVar5 >> 1;
      bVar2 = 1 < uVar4;
      uVar4 = (uint)uVar5;
    } while (bVar2);
  }
  return uVar3;
}

Assistant:

uint FunctionBody::GetNumberOfRecursiveCallSites()
    {
        uint recursiveInlineSpan = 0;
        uint recursiveCallSiteInlineInfo = 0;
#if ENABLE_PROFILE_INFO
        if (this->HasDynamicProfileInfo())
        {
            recursiveCallSiteInlineInfo = this->dynamicProfileInfo->GetRecursiveInlineInfo();
        }
#endif

        while (recursiveCallSiteInlineInfo)
        {
            recursiveInlineSpan += (recursiveCallSiteInlineInfo & 1);
            recursiveCallSiteInlineInfo >>= 1;
        }
        return recursiveInlineSpan;
    }